

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O2

void __thiscall pbrt::SDVertex::oneRing(SDVertex *this,Point3f *p)

{
  float fVar1;
  SDFace *this_00;
  SDVertex *pSVar2;
  SDFace *this_01;
  SDFace *face;
  Point3f *pPVar3;
  
  this_00 = this->startFace;
  if (this->boundary == false) {
    do {
      pSVar2 = SDFace::nextVert(this_00,this);
      fVar1 = (pSVar2->p).super_Tuple3<pbrt::Point3,_float>.y;
      (p->super_Tuple3<pbrt::Point3,_float>).x = (pSVar2->p).super_Tuple3<pbrt::Point3,_float>.x;
      (p->super_Tuple3<pbrt::Point3,_float>).y = fVar1;
      (p->super_Tuple3<pbrt::Point3,_float>).z = (pSVar2->p).super_Tuple3<pbrt::Point3,_float>.z;
      this_00 = SDFace::nextFace(this_00,this);
      p = p + 1;
    } while (this_00 != this->startFace);
  }
  else {
    do {
      this_01 = this_00;
      this_00 = SDFace::nextFace(this_01,this);
    } while (this_00 != (SDFace *)0x0);
    pSVar2 = SDFace::nextVert(this_01,this);
    fVar1 = (pSVar2->p).super_Tuple3<pbrt::Point3,_float>.y;
    (p->super_Tuple3<pbrt::Point3,_float>).x = (pSVar2->p).super_Tuple3<pbrt::Point3,_float>.x;
    (p->super_Tuple3<pbrt::Point3,_float>).y = fVar1;
    (p->super_Tuple3<pbrt::Point3,_float>).z = (pSVar2->p).super_Tuple3<pbrt::Point3,_float>.z;
    pPVar3 = p + 1;
    do {
      pSVar2 = SDFace::prevVert(this_01,this);
      fVar1 = (pSVar2->p).super_Tuple3<pbrt::Point3,_float>.y;
      (pPVar3->super_Tuple3<pbrt::Point3,_float>).x =
           (pSVar2->p).super_Tuple3<pbrt::Point3,_float>.x;
      (pPVar3->super_Tuple3<pbrt::Point3,_float>).y = fVar1;
      (pPVar3->super_Tuple3<pbrt::Point3,_float>).z =
           (pSVar2->p).super_Tuple3<pbrt::Point3,_float>.z;
      this_01 = SDFace::prevFace(this_01,this);
      pPVar3 = pPVar3 + 1;
    } while (this_01 != (SDFace *)0x0);
  }
  return;
}

Assistant:

void SDVertex::oneRing(Point3f *p) {
    if (!boundary) {
        // Get one-ring vertices for interior vertex
        SDFace *face = startFace;
        do {
            *p++ = face->nextVert(this)->p;
            face = face->nextFace(this);
        } while (face != startFace);
    } else {
        // Get one-ring vertices for boundary vertex
        SDFace *face = startFace, *f2;
        while ((f2 = face->nextFace(this)) != nullptr)
            face = f2;
        *p++ = face->nextVert(this)->p;
        do {
            *p++ = face->prevVert(this)->p;
            face = face->prevFace(this);
        } while (face != nullptr);
    }
}